

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_hash.h
# Opt level: O2

uint64_t sylvan_tabhash16(uint64_t a,uint64_t b,uint64_t seed)

{
  long lVar1;
  ulong uVar2;
  
  for (lVar1 = 0; (int)lVar1 != 0x4000; lVar1 = lVar1 + 0x800) {
    uVar2 = a & 0xff;
    a = a >> 8;
    seed = seed ^ *(ulong *)((long)sylvan_tabhash_table + lVar1 + uVar2 * 8);
  }
  for (lVar1 = 0; (int)lVar1 != 0x4000; lVar1 = lVar1 + 0x800) {
    uVar2 = b & 0xff;
    b = b >> 8;
    seed = seed ^ *(ulong *)(lVar1 + uVar2 * 8 + 0x136350);
  }
  return seed;
}

Assistant:

static inline uint64_t
sylvan_tabhash16(uint64_t a, uint64_t b, uint64_t seed)
{
    uint64_t *t = sylvan_tabhash_table;
    for (int i=0; i<8; i++) {
        seed ^= t[(uint8_t)a];
        t += 256; // next table
        a >>= 8;
    }
    for (int i=0; i<8; i++) {
        seed ^= t[(uint8_t)b];
        t += 256; // next table
        b >>= 8;
    }
    return seed;
}